

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_tree.cpp
# Opt level: O3

void __thiscall RegexTree::or_link(RegexTree *this,RegexTree *rhs)

{
  tree_node *ptVar1;
  
  ptVar1 = (tree_node *)operator_new(0x18);
  ptVar1->c = '\n';
  ptVar1->right = this->root;
  ptVar1->left = rhs->root;
  rhs->root = (tree_node *)0x0;
  this->root = ptVar1;
  return;
}

Assistant:

void RegexTree::or_link(RegexTree &rhs) {
    tree_node *_or = new tree_node;
    _or->c = OR;
    _or->right = root;
    _or->left = rhs.root;
    rhs.root = nullptr;
    root = _or;
}